

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionEvaluation.hpp
# Opt level: O3

Option<Kernel::PolyNf> * __thiscall
Inferences::trySimplifyUnaryMinus<Kernel::NumTraits<Kernel::IntegerConstantType>>
          (Option<Kernel::PolyNf> *__return_storage_ptr__,Inferences *this,PolyNf *evalArgs)

{
  ulong uVar1;
  long lVar2;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar3;
  Polynom out;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> local_c0;
  undefined1 local_a0 [24];
  uint local_88 [4];
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_78;
  __mpz_struct local_58;
  AnyPoly local_48;
  
  Kernel::PolyNf::wrapPoly<Kernel::NumTraits<Kernel::IntegerConstantType>>((PolyNf *)local_a0);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::Stack
            (&local_c0,
             (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
             local_a0._8_8_);
  local_78._summands._cursor = local_c0._cursor;
  local_78._summands._stack = local_c0._stack;
  if ((int)((ulong)((long)local_c0._cursor - (long)local_c0._stack) >> 5) != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      pMVar3 = local_c0._stack;
      Kernel::IntegerConstantType::IntegerConstantType((IntegerConstantType *)&local_58,-1);
      Kernel::IntegerConstantType::operator*
                ((IntegerConstantType *)local_a0,
                 (IntegerConstantType *)((long)&(pMVar3->numeral)._val[0]._mp_alloc + lVar2));
      mpz_swap((__mpz_struct *)((long)&((local_c0._stack)->numeral)._val[0]._mp_alloc + lVar2),
               (__mpz_struct *)local_a0);
      mpz_clear((__mpz_struct *)local_a0);
      mpz_clear(&local_58);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x20;
      local_78._summands._cursor = local_c0._cursor;
      local_78._summands._stack = local_c0._stack;
    } while (uVar1 < ((ulong)((long)local_c0._cursor - (long)local_c0._stack) >> 5 & 0xffffffff));
  }
  local_78._summands._capacity = local_c0._capacity;
  local_c0._capacity = 0;
  local_78._summands._end = local_c0._end;
  local_c0._end = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  local_c0._stack = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  local_c0._cursor = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  Lib::
  perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
            ((Lib *)local_88,&local_78);
  local_48.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[7] = '\0';
  local_48.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._0_8_ = (ulong)local_88[0] << 8;
  local_48.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content._8_7_ = SUB87(local_88._8_8_,0);
  local_48.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[0xf] = SUB81(local_88._8_8_,7);
  local_48.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._17_3_ = 0;
  Kernel::PolyNf::PolyNf((PolyNf *)local_a0,&local_48);
  Lib::OptionBase<Kernel::PolyNf>::OptionBase
            (&__return_storage_ptr__->super_OptionBase<Kernel::PolyNf>,(PolyNf *)local_a0);
  while (local_78._summands._cursor != local_78._summands._stack) {
    local_78._summands._cursor = local_78._summands._cursor + -1;
    mpz_clear((__mpz_struct *)local_78._summands._cursor);
  }
  pMVar3 = local_c0._cursor;
  if (local_78._summands._cursor != (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
    uVar1 = local_78._summands._capacity << 5;
    if (uVar1 == 0) {
      ((local_78._summands._stack)->numeral)._val[0]._mp_alloc =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      ((local_78._summands._stack)->numeral)._val[0]._mp_size =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_78._summands._stack;
    }
    else if (uVar1 < 0x21) {
      ((local_78._summands._stack)->numeral)._val[0]._mp_alloc =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      ((local_78._summands._stack)->numeral)._val[0]._mp_size =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_78._summands._stack;
    }
    else if (uVar1 < 0x31) {
      ((local_78._summands._stack)->numeral)._val[0]._mp_alloc =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      ((local_78._summands._stack)->numeral)._val[0]._mp_size =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_78._summands._stack;
    }
    else if (uVar1 < 0x41) {
      ((local_78._summands._stack)->numeral)._val[0]._mp_alloc =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      ((local_78._summands._stack)->numeral)._val[0]._mp_size =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_78._summands._stack;
    }
    else {
      operator_delete(local_78._summands._stack,0x10);
      pMVar3 = local_c0._cursor;
    }
  }
  while (pMVar3 != local_c0._stack) {
    mpz_clear((__mpz_struct *)(pMVar3 + -1));
    pMVar3 = pMVar3 + -1;
  }
  if (pMVar3 != (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
    uVar1 = local_c0._capacity << 5;
    if (uVar1 == 0) {
      ((local_c0._stack)->numeral)._val[0]._mp_alloc = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      ((local_c0._stack)->numeral)._val[0]._mp_size = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_c0._stack;
    }
    else if (uVar1 < 0x21) {
      ((local_c0._stack)->numeral)._val[0]._mp_alloc = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      ((local_c0._stack)->numeral)._val[0]._mp_size = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_c0._stack;
    }
    else if (uVar1 < 0x31) {
      ((local_c0._stack)->numeral)._val[0]._mp_alloc = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      ((local_c0._stack)->numeral)._val[0]._mp_size = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_c0._stack;
    }
    else if (uVar1 < 0x41) {
      ((local_c0._stack)->numeral)._val[0]._mp_alloc = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      ((local_c0._stack)->numeral)._val[0]._mp_size = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_c0._stack;
    }
    else {
      operator_delete(local_c0._stack,0x10);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Option<PolyNf> trySimplifyUnaryMinus(PolyNf* evalArgs)
{
  using Numeral = typename Number::ConstantType;
  using Polynom = Polynom<Number>;

  auto out = Polynom(*evalArgs[0].template wrapPoly<Number>());

  for (unsigned i = 0; i < out.nSummands(); i++) {
     out.summandAt(i).numeral = out.summandAt(i).numeral * Numeral(-1);
  }

  return some<PolyNf>(PolyNf(AnyPoly(perfect(std::move(out)))));
}